

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_2cadff::TfFinder::handleToken(TfFinder *this,Token *token)

{
  token_type_e tVar1;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  ulong i;
  double dVar5;
  string value;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  tVar1 = token->type;
  pcVar2 = (token->value)._M_dataplus._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + (token->value)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->DA,&token->raw_value);
  switch(tVar1) {
  case tt_integer:
  case tt_real:
    dVar5 = strtod((char *)local_70[0],(char **)0x0);
    this->last_num = dVar5;
    i = ((long)(this->DA).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->DA).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
    if ((i & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
    }
    this->last_num_idx = (int)i;
    goto switchD_0016d952_caseD_a;
  case tt_name:
    lVar4 = 0x50;
    break;
  default:
    goto switchD_0016d952_caseD_a;
  case tt_word:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Tf","");
    bVar3 = QPDFTokenizer::Token::isWord(token,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) goto switchD_0016d952_caseD_a;
    dVar5 = this->last_num;
    if ((1.0 < dVar5) && (dVar5 < 1000.0)) {
      this->tf = dVar5;
    }
    this->tf_idx = this->last_num_idx;
    lVar4 = 0x20;
  }
  std::__cxx11::string::_M_assign
            ((string *)((long)&(this->super_TokenFilter)._vptr_TokenFilter + lVar4));
switchD_0016d952_caseD_a:
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

void
TfFinder::handleToken(QPDFTokenizer::Token const& token)
{
    QPDFTokenizer::token_type_e ttype = token.getType();
    std::string value = token.getValue();
    DA.push_back(token.getRawValue());
    switch (ttype) {
    case QPDFTokenizer::tt_integer:
    case QPDFTokenizer::tt_real:
        last_num = strtod(value.c_str(), nullptr);
        last_num_idx = QIntC::to_int(DA.size() - 1);
        break;

    case QPDFTokenizer::tt_name:
        last_name = value;
        break;

    case QPDFTokenizer::tt_word:
        if (token.isWord("Tf")) {
            if ((last_num > 1.0) && (last_num < 1000.0)) {
                // These ranges are arbitrary but keep us from doing insane things or suffering from
                // over/underflow
                tf = last_num;
            }
            tf_idx = last_num_idx;
            font_name = last_name;
        }
        break;

    default:
        break;
    }
}